

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_rfc5444_reader_dropcontext.c
# Opt level: O2

rfc5444_result cb_end_packet(rfc5444_reader_tlvblock_context *c,_Bool dropped)

{
  uint uVar1;
  int iVar2;
  
  uVar1 = c->consumer->order;
  printf("%s: packet end (order %d): %d\n","cb_end_packet",(ulong)uVar1,(ulong)(uint)callback_index)
  ;
  iVar2 = callback_index + 1;
  result_tlv_packet[1][(long)(int)uVar1 + 1] = callback_index;
  callback_index = iVar2;
  return idxcb_end_packet[(long)(int)uVar1 + 1];
}

Assistant:

static enum rfc5444_result
cb_end_packet(struct rfc5444_reader_tlvblock_context *c,
    bool dropped __attribute__ ((unused))) {
  int oi = c->consumer->order - 1;

#ifdef PRINT_CB
  printf("%s: packet end (order %d): %d\n", __func__, c->consumer->order, callback_index);
#endif
  idxcb_end_packet[oi] = callback_index++;
  return result_end_packet[oi];
}